

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

Vec_Int_t * Mop_ManCompatiblePairs(Vec_Int_t *vPairs,int nObjs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int iVar4;
  int iVar5;
  int iVar6;
  
  p = Vec_IntStart(nObjs);
  p_00 = Vec_IntAlloc(vPairs->nSize);
  iVar6 = 1;
  for (iVar5 = 0; iVar1 = vPairs->nSize, iVar5 < iVar1; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vPairs,iVar5);
    Vec_IntAddToEntry(p,iVar1,1);
  }
  for (; iVar6 < iVar1; iVar6 = iVar6 + 2) {
    iVar5 = Vec_IntEntry(vPairs,iVar6 + -1);
    iVar1 = Vec_IntEntry(vPairs,iVar6);
    iVar2 = Vec_IntEntry(p,iVar5);
    if ((iVar2 == 1) || (iVar2 = Vec_IntEntry(p,iVar1), iVar2 == 1)) {
      iVar3 = Vec_IntEntry(p,iVar5);
      iVar2 = iVar1;
      iVar4 = iVar5;
      if (iVar3 == 1) {
        iVar2 = iVar5;
        iVar4 = iVar1;
      }
      Vec_IntPushTwo(p_00,iVar2,iVar4);
      Vec_IntWriteEntry(p,iVar5,-1);
      Vec_IntWriteEntry(p,iVar1,-1);
    }
    iVar1 = vPairs->nSize;
  }
  for (iVar6 = 1; iVar6 < iVar1; iVar6 = iVar6 + 2) {
    iVar5 = Vec_IntEntry(vPairs,iVar6 + -1);
    iVar1 = Vec_IntEntry(vPairs,iVar6);
    iVar2 = Vec_IntEntry(p,iVar5);
    if ((0 < iVar2) && (iVar2 = Vec_IntEntry(p,iVar1), 0 < iVar2)) {
      Vec_IntPushTwo(p_00,iVar5,iVar1);
      Vec_IntWriteEntry(p,iVar5,-1);
      Vec_IntWriteEntry(p,iVar1,-1);
    }
    iVar1 = vPairs->nSize;
  }
  for (iVar6 = 1; iVar6 < iVar1; iVar6 = iVar6 + 2) {
    iVar5 = Vec_IntEntry(vPairs,iVar6 + -1);
    iVar1 = Vec_IntEntry(vPairs,iVar6);
    iVar2 = Vec_IntEntry(p,iVar5);
    if ((0 < iVar2) || (iVar2 = Vec_IntEntry(p,iVar1), 0 < iVar2)) {
      iVar3 = Vec_IntEntry(p,iVar5);
      iVar2 = iVar1;
      iVar4 = iVar5;
      if (0 < iVar3) {
        iVar2 = iVar5;
        iVar4 = iVar1;
      }
      Vec_IntPushTwo(p_00,iVar2,iVar4);
      Vec_IntWriteEntry(p,iVar5,-1);
      Vec_IntWriteEntry(p,iVar1,-1);
    }
    iVar1 = vPairs->nSize;
  }
  Vec_IntFree(p);
  return p_00;
}

Assistant:

Vec_Int_t * Mop_ManCompatiblePairs( Vec_Int_t * vPairs, int nObjs )
{
    int i, Entry, Entry2;
    Vec_Int_t * vCounts = Vec_IntStart( nObjs );
    Vec_Int_t * vPairsNew = Vec_IntAlloc( Vec_IntSize(vPairs) );
    Vec_IntForEachEntry( vPairs, Entry, i )
        Vec_IntAddToEntry( vCounts, Entry, 1 );
    // include pairs which have those that appear only once
    Vec_IntForEachEntryDouble( vPairs, Entry, Entry2, i )
        if ( Vec_IntEntry(vCounts, Entry) == 1 || Vec_IntEntry(vCounts, Entry2) == 1 )
        {
            if ( Vec_IntEntry(vCounts, Entry) == 1 )
                Vec_IntPushTwo( vPairsNew, Entry, Entry2 );
            else
                Vec_IntPushTwo( vPairsNew, Entry2, Entry );
            Vec_IntWriteEntry( vCounts, Entry, -1 );
            Vec_IntWriteEntry( vCounts, Entry2, -1 );
        }
    // add those remaining pairs that are both present
    Vec_IntForEachEntryDouble( vPairs, Entry, Entry2, i )
        if ( Vec_IntEntry(vCounts, Entry) > 0 && Vec_IntEntry(vCounts, Entry2) > 0 )
        {
            Vec_IntPushTwo( vPairsNew, Entry, Entry2 );
            Vec_IntWriteEntry( vCounts, Entry, -1 );
            Vec_IntWriteEntry( vCounts, Entry2, -1 );
        }
    // add remaining pairs
    Vec_IntForEachEntryDouble( vPairs, Entry, Entry2, i )
        if ( Vec_IntEntry(vCounts, Entry) > 0 || Vec_IntEntry(vCounts, Entry2) > 0 )
        {
            if ( Vec_IntEntry(vCounts, Entry) > 0 )
                Vec_IntPushTwo( vPairsNew, Entry, Entry2 );
            else
                Vec_IntPushTwo( vPairsNew, Entry2, Entry );
            Vec_IntWriteEntry( vCounts, Entry, -1 );
            Vec_IntWriteEntry( vCounts, Entry2, -1 );
        }
    Vec_IntFree( vCounts );
    // verify the result
    if ( 0 )
    {
        Vec_Int_t * vTemp1 = Vec_IntDup( vPairs );
        Vec_Int_t * vTemp2 = Vec_IntDup( vPairsNew );
        Vec_IntUniqify( vTemp1 );
        Vec_IntUniqify( vTemp2 );
        assert( Vec_IntEqual( vTemp1, vTemp2 ) );
        Vec_IntFree( vTemp1 );
        Vec_IntFree( vTemp2 );
    }
    return vPairsNew;
}